

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

bool __thiscall
pstore::file::file_handle::lock
          (file_handle *this,uint64_t offset,size_t size,lock_kind kind,blocking_mode block)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_48;
  uint64_t uStack_40;
  size_t local_38;
  undefined8 uStack_30;
  
  if ((long)(size | offset) < 0) {
    raise<std::errc,char[5]>(invalid_argument,(char (*) [5])"lock");
  }
  if (this->file_ != -1) {
    iVar3 = 7;
    if (block != blocking) {
      iVar3 = 0;
    }
    iVar2 = 6;
    if (block != non_blocking) {
      iVar2 = iVar3;
    }
    uStack_30 = 0;
    local_48 = (ulong)(kind == exclusive_write);
    uStack_40 = offset;
    local_38 = size;
    iVar3 = fcntl(this->file_,iVar2,&local_48);
    if (iVar3 != 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if ((block != non_blocking) || ((iVar2 != 0xb && (iVar2 != 0xd)))) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        pcVar1 = (this->path_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar1,pcVar1 + (this->path_)._M_string_length);
        (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                  (iVar2,"fcntl/lock failed",&local_68);
      }
    }
    return iVar3 == 0;
  }
  raise<std::errc>(bad_file_descriptor);
}

Assistant:

bool file_handle::lock (std::uint64_t const offset, std::size_t const size,
                                lock_kind const kind, blocking_mode const block) {
            if (offset > uoff_max || size > uoff_max) {
                raise (std::errc::invalid_argument, "lock");
            }
            this->ensure_open ();

            int cmd = 0;
            switch (block) {
            case blocking_mode::non_blocking: cmd = F_SETLK; break;
            case blocking_mode::blocking: cmd = F_SETLKW; break;
            }

            short type = 0;
            switch (kind) {
            case lock_kind::shared_read: type = F_RDLCK; break;
            case lock_kind::exclusive_write: type = F_WRLCK; break;
            }

            bool got_lock = true;
            if (file_handle::lock_reg (file_,
                                       cmd, // set a file lock (maybe a blocking one),
                                       type, static_cast<off_t> (offset), SEEK_SET,
                                       static_cast<off_t> (size)) != 0) {
                int const err = errno;
                if (block == blocking_mode::non_blocking && (err == EACCES || err == EAGAIN)) {
                    // The cmd argument is F_SETLK; the type of lock (l_type) is a shared (F_RDLCK)
                    // or exclusive (F_WRLCK) lock and the segment of a file to be locked is already
                    // exclusive-locked by another process, or the type is an exclusive lock and
                    // some portion of the segment of a file to be locked is already shared-locked
                    // or exclusive-locked by another process
                    got_lock = false;
                } else {
                    raise_file_error (err, "fcntl/lock failed", this->path ());
                }
            }
            return got_lock;
        }